

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall PrintStatement::print(PrintStatement *this)

{
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> *__range1;
  pointer ppEVar1;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> testlist;
  vector<ExprNode_*,_std::allocator<ExprNode_*>_> local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"print ",6);
  std::vector<ExprNode_*,_std::allocator<ExprNode_*>_>::vector(&local_38,&this->_testlist->_list);
  for (ppEVar1 = local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar1 !=
      local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    (**(*ppEVar1)->_vptr_ExprNode)();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\b\b ",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  if (local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<ExprNode_*,_std::allocator<ExprNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrintStatement::print() {
    std::cout << "print ";
    std::vector<ExprNode*>testlist = testList()->getTestlist();
    for(ExprNode* exprNode : testlist){
        exprNode->print();
        std::cout << ", ";
    }
    std::cout << "\b\b ";
    std::cout << std::endl;

}